

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O2

long __thiscall
passthrough_resampler<short>::fill
          (passthrough_resampler<short> *this,void *input_buffer,long *input_frames_count,
          void *output_buffer,long output_frames)

{
  auto_array<short> *this_00;
  ulong uVar1;
  long lVar2;
  short *psVar3;
  ulong uVar4;
  
  if (output_buffer == (void *)0x0 && input_buffer != (void *)0x0) {
    output_frames = *input_frames_count;
  }
  else {
    if (input_buffer == (void *)0x0) {
      uVar4 = 0;
      psVar3 = (short *)0x0;
      goto LAB_0010dd4a;
    }
    this_00 = &this->internal_input_buffer;
    lVar2 = *input_frames_count;
    if (lVar2 < output_frames || (this->internal_input_buffer).length_ != 0) {
      auto_array<short>::push
                (this_00,(short *)input_buffer,lVar2 * (ulong)(this->super_processor).channels);
      uVar1 = (this->internal_input_buffer).length_;
      uVar4 = (ulong)(this->super_processor).channels * output_frames;
      if (uVar1 <= uVar4 && uVar4 - uVar1 != 0) {
        auto_array<short>::push_silence(this_00,uVar4 - uVar1);
        uVar4 = uVar1;
      }
      psVar3 = this_00->data_;
      goto LAB_0010dd4a;
    }
    if (lVar2 - output_frames != 0 && output_frames <= lVar2) {
      uVar4 = (ulong)(this->super_processor).channels;
      auto_array<short>::push
                (this_00,(short *)((long)input_buffer + uVar4 * output_frames * 2),
                 (lVar2 - output_frames) * uVar4);
    }
  }
  uVar4 = 0;
  psVar3 = (short *)input_buffer;
LAB_0010dd4a:
  lVar2 = (*this->data_callback)(this->stream,this->user_ptr,psVar3,output_buffer,output_frames);
  if (input_buffer != (void *)0x0) {
    if (uVar4 != 0) {
      auto_array<short>::pop(&this->internal_input_buffer,(short *)0x0,uVar4);
      output_frames = uVar4 / (this->super_processor).channels;
    }
    *input_frames_count = output_frames;
    drop_audio_if_needed(this);
  }
  return lVar2;
}

Assistant:

long
passthrough_resampler<T>::fill(void * input_buffer, long * input_frames_count,
                               void * output_buffer, long output_frames)
{
  if (input_buffer) {
    assert(input_frames_count);
  }
  assert((input_buffer && output_buffer) ||
         (output_buffer && !input_buffer &&
          (!input_frames_count || *input_frames_count == 0)) ||
         (input_buffer && !output_buffer && output_frames == 0));

  // When we have no pending input data and exactly as much input
  // as output data, we don't need to copy it into the internal buffer
  // and can directly forward it to the callback.
  void * in_buf = input_buffer;
  unsigned long pop_input_count = 0u;
  if (input_buffer && !output_buffer) {
    output_frames = *input_frames_count;
  } else if (input_buffer) {
    if (internal_input_buffer.length() != 0 ||
        *input_frames_count < output_frames) {
      // If we have pending input data left and have to first append the input
      // so we can pass it as one pointer to the callback. Or this is a glitch.
      // It can happen when system's performance is poor. Audible silence is
      // being pushed at the end of the short input buffer. An improvement for
      // the future is to resample to the output number of frames, when that
      // happens.
      internal_input_buffer.push(static_cast<T *>(input_buffer),
                                 frames_to_samples(*input_frames_count));
      if (internal_input_buffer.length() < frames_to_samples(output_frames)) {
        // This is unxpected but it can happen when a glitch occurs. Fill the
        // buffer with silence. First keep the actual number of input samples
        // used without the silence.
        pop_input_count = internal_input_buffer.length();
        internal_input_buffer.push_silence(frames_to_samples(output_frames) -
                                           internal_input_buffer.length());
      } else {
        pop_input_count = frames_to_samples(output_frames);
      }
      in_buf = internal_input_buffer.data();
    } else if (*input_frames_count > output_frames) {
      // In this case we have more input that we need output and
      // fill the overflowing input into internal_input_buffer
      // Since we have no other pending data, we can nonetheless
      // pass the current input data directly to the callback
      assert(pop_input_count == 0);
      unsigned long samples_off = frames_to_samples(output_frames);
      internal_input_buffer.push(
          static_cast<T *>(input_buffer) + samples_off,
          frames_to_samples(*input_frames_count - output_frames));
    }
  }

  long rv =
      data_callback(stream, user_ptr, in_buf, output_buffer, output_frames);

  if (input_buffer) {
    if (pop_input_count) {
      internal_input_buffer.pop(nullptr, pop_input_count);
      *input_frames_count = samples_to_frames(pop_input_count);
    } else {
      *input_frames_count = output_frames;
    }
    drop_audio_if_needed();
  }

  return rv;
}